

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_param_test.cpp
# Opt level: O3

void __thiscall sign_verify::test_method(sign_verify *this)

{
  int iVar1;
  size_t max_signature_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  size_t siglen;
  picnic3_l3_publickey_t public_key;
  array<unsigned_char,_32UL> m;
  picnic3_l3_privatekey_t private_key;
  assertion_result local_1b8;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  local_1a0;
  _func_int *local_190;
  pointer local_188;
  element_type *peStack_180;
  shared_count local_178;
  char *local_170;
  char *local_168;
  _func_int *local_160;
  lazy_ostream local_158;
  undefined1 *local_148;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  *local_140;
  assertion_result local_138 [2];
  undefined1 local_108 [32];
  const_string local_e8;
  const_string local_d8;
  const_string local_c8;
  const_string local_b8;
  const_string local_a8;
  const_string local_98;
  const_string local_88;
  lazy_ostream local_78;
  undefined1 *local_68;
  undefined1 *local_60;
  
  local_190 = (_func_int *)picnic3_l3_signature_size();
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efb3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1e;
  local_158._vptr_lazy_ostream = &local_190;
  boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
            (local_138,(value_expr<const_unsigned_long_&> *)&local_158,false);
  local_60 = local_108;
  local_108._0_8_ = "max_signature_size";
  local_78.m_empty = false;
  local_78._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00179d08;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_88.m_end = "";
  local_108._8_8_ = "";
  boost::test_tools::tt_detail::report_assertion
            (local_138,&local_78,&local_88,0x1e,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_138[0].m_message.pn);
  (anonymous_namespace)::randomize_container<std::array<unsigned_char,32ul>>
            ((array<unsigned_char,_32UL> *)local_108);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efb3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x26;
  iVar1 = picnic3_l3_keygen(local_138,&local_78);
  local_1a0.m_lhs.m_value._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&local_188,(value_expr<bool> *)&local_1a0,false);
  local_1b8._0_8_ = "!picnic3_l3_keygen(&public_key, &private_key)";
  local_158.m_empty = false;
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00179d08;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_98.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_98.m_end = "";
  local_1b8.m_message.px = (element_type *)0x1595b8;
  local_140 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_1b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_188,&local_158,&local_98,0x26,CHECK,CHECK_BUILT_ASSERTION,0)
  ;
  boost::detail::shared_count::~shared_count(&local_178);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efb3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x29;
  iVar1 = picnic3_l3_validate_keypair(&local_78,local_138);
  local_1a0.m_lhs.m_value._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&local_188,(value_expr<bool> *)&local_1a0,false);
  local_1b8._0_8_ = "!picnic3_l3_validate_keypair(&private_key, &public_key)";
  local_158.m_empty = false;
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00179d08;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_a8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_a8.m_end = "";
  local_1b8.m_message.px = (element_type *)0x1595f0;
  local_140 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_1b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_188,&local_158,&local_a8,0x29,CHECK,CHECK_BUILT_ASSERTION,0)
  ;
  boost::detail::shared_count::~shared_count(&local_178);
  local_178.pi_ = (sp_counted_base *)0x0;
  local_188 = (pointer)0x0;
  peStack_180 = (element_type *)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,
             (size_type)local_190);
  local_160 = local_190;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efb3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x30;
  iVar1 = picnic3_l3_sign(&local_78,local_108,0x20,local_188,&local_160);
  local_170 = (char *)CONCAT71(local_170._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_1b8,(value_expr<bool> *)&local_170,false);
  local_1a0.m_lhs.m_value = (unsigned_long *)0x1595f1;
  local_158.m_empty = false;
  local_b8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_b8.m_end = "";
  local_1a0.m_rhs = (unsigned_long *)0x159638;
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00179d08;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = &local_1a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,&local_158,&local_b8,0x30,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efb3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x31;
  local_1a0.m_rhs = (unsigned_long *)((ulong)local_1a0.m_rhs & 0xffffffff00000000);
  local_1a0.m_lhs.m_value = (unsigned_long *)&local_160;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
  ::evaluate(&local_1b8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
              *)&local_1a0,false);
  local_170 = "siglen > 0";
  local_158.m_empty = false;
  local_c8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_c8.m_end = "";
  local_168 = "";
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00179d08;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_170;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,&local_158,&local_c8,0x31,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efb3);
  local_1a0.m_rhs = (unsigned_long *)&local_190;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x32;
  local_1a0.m_lhs.m_value = (unsigned_long *)&local_160;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_1b8,&local_1a0,false);
  local_170 = "siglen <= max_signature_size";
  local_158.m_empty = false;
  local_d8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_d8.m_end = "";
  local_168 = "";
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00179d08;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_170;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,&local_158,&local_d8,0x32,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efb3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x34;
  iVar1 = picnic3_l3_verify(local_138,local_108,0x20,local_188,local_160);
  local_170 = (char *)CONCAT71(local_170._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_1b8,(value_expr<bool> *)&local_170,false);
  local_1a0.m_lhs.m_value = (unsigned_long *)0x159661;
  local_158.m_empty = false;
  local_e8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_e8.m_end = "";
  local_1a0.m_rhs = (unsigned_long *)0x1596a8;
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00179d08;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = &local_1a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,&local_158,&local_e8,0x34,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
  if (local_188 != (pointer)0x0) {
    operator_delete(local_188);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_verify) {
  const size_t max_signature_size = PICNIC_CONCAT(PARAM, signature_size)();
  BOOST_TEST(max_signature_size);

  std::array<uint8_t, 32> m;
  randomize_container(m);

  // Create a key pair
  PICNIC_CONCAT(PARAM, privatekey_t) private_key;
  PICNIC_CONCAT(PARAM, publickey_t) public_key;
  BOOST_TEST(!PICNIC_CONCAT(PARAM, keygen)(&public_key, &private_key));

  // Valid key pair
  BOOST_TEST(!PICNIC_CONCAT(PARAM, validate_keypair)(&private_key, &public_key));

  std::vector<uint8_t> sig;
  sig.resize(max_signature_size);
  size_t siglen = max_signature_size;

  // Sign a message
  BOOST_TEST(!PICNIC_CONCAT(PARAM, sign)(&private_key, m.data(), m.size(), sig.data(), &siglen));
  BOOST_TEST(siglen > 0);
  BOOST_TEST(siglen <= max_signature_size);
  // Verify signature
  BOOST_TEST(!PICNIC_CONCAT(PARAM, verify)(&public_key, m.data(), m.size(), sig.data(), siglen));
}